

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qo_manager.cc
# Opt level: O3

RC __thiscall QO_Manager::CondToAttrIdx(QO_Manager *this,int condIndex,int *attrIdx1,int *attrIdx2)

{
  RC RVar1;
  RelAttr attr;
  
  attr.attrName = this->conds[condIndex].lhsAttr.attrName;
  attr.relName = this->conds[condIndex].lhsAttr.relName;
  RVar1 = QL_Manager::GetAttrCatEntryPos(this->qlm,attr,attrIdx1);
  if (RVar1 == 0) {
    if (this->conds[condIndex].bRhsIsAttr == 0) {
      *attrIdx2 = -1;
    }
    else {
      RVar1 = QL_Manager::GetAttrCatEntryPos(this->qlm,this->conds[condIndex].rhsAttr,attrIdx2);
      if (RVar1 != 0) {
        return RVar1;
      }
    }
    RVar1 = 0;
  }
  return RVar1;
}

Assistant:

RC QO_Manager::CondToAttrIdx(int condIndex, int &attrIdx1, int &attrIdx2){
  RC rc = 0;
  if((rc = qlm.GetAttrCatEntryPos(conds[condIndex].lhsAttr, attrIdx1)))
    return (rc);
  if(conds[condIndex].bRhsIsAttr){
    if((rc = qlm.GetAttrCatEntryPos(conds[condIndex].rhsAttr, attrIdx2)))
      return (rc);
  }
  else
    attrIdx2 = -1;
  return (0);
}